

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall amrex::MLMG::mgVcycle(MLMG *this,int amrlev,int mglev_top)

{
  long lVar1;
  long lVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  int i_1;
  ulong uVar5;
  MLLinOp *pMVar6;
  int i;
  int iVar7;
  int iVar8;
  ulong uVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  Print local_1b8;
  
  uVar9 = (long)(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[amrlev] - 1;
  uVar5 = (long)mglev_top;
  while (iVar8 = (int)uVar5, (long)uVar5 < (long)uVar9) {
    pMVar6 = this->linop;
    if (3 < this->verbose) {
      (*pMVar6->_vptr_MLLinOp[0x32])
                (pMVar6,uVar5 * 8 +
                        *(long *)&(this->res).
                                  super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                  super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
      poVar4 = OutStream();
      Print::Print(&local_1b8,poVar4);
      poVar3 = &local_1b8.ss;
      std::operator<<((ostream *)poVar3,"AT LEVEL ");
      std::ostream::operator<<(poVar3,amrlev);
      std::operator<<((ostream *)poVar3," ");
      std::ostream::operator<<(poVar3,iVar8);
      std::operator<<((ostream *)poVar3,"   DN: Norm before smooth ");
      std::ostream::_M_insert<double>(extraout_XMM0_Qa);
      std::operator<<((ostream *)poVar3,"\n");
      Print::~Print(&local_1b8);
      pMVar6 = this->linop;
    }
    lVar2 = uVar5 * 8;
    (*pMVar6->_vptr_MLLinOp[0x2e])
              (pMVar6,*(long *)&(this->cor).
                                super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2)
    ;
    for (iVar7 = 0; iVar7 < this->nu1; iVar7 = iVar7 + 1) {
      (*this->linop->_vptr_MLLinOp[0x39])
                (this->linop,amrlev,uVar5 & 0xffffffff,
                 *(long *)&(this->cor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2,
                 *(long *)&(this->res).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2);
    }
    computeResOfCorrection(this,amrlev,iVar8);
    if (3 < this->verbose) {
      (*this->linop->_vptr_MLLinOp[0x32])
                (this->linop,
                 *(long *)&(this->rescor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2);
      poVar4 = OutStream();
      Print::Print(&local_1b8,poVar4);
      poVar3 = &local_1b8.ss;
      std::operator<<((ostream *)poVar3,"AT LEVEL ");
      std::ostream::operator<<(poVar3,amrlev);
      std::operator<<((ostream *)poVar3," ");
      std::ostream::operator<<(poVar3,iVar8);
      std::operator<<((ostream *)poVar3,"   DN: Norm after  smooth ");
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
      std::operator<<((ostream *)poVar3,"\n");
      Print::~Print(&local_1b8);
    }
    lVar1 = uVar5 * 8;
    uVar5 = uVar5 + 1;
    (*this->linop->_vptr_MLLinOp[0x3a])
              (this->linop,amrlev,uVar5 & 0xffffffff,
               lVar1 + 8 +
               *(long *)&(this->res).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,
               lVar2 + *(long *)&(this->rescor).
                                 super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                 super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
  }
  iVar8 = (int)uVar9;
  if (amrlev == 0) {
    if (3 < this->verbose) {
      (*this->linop->_vptr_MLLinOp[0x32])
                (this->linop,
                 uVar9 * 8 +
                 *(long *)&(this->res).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
      poVar4 = OutStream();
      Print::Print(&local_1b8,poVar4);
      poVar3 = &local_1b8.ss;
      std::operator<<((ostream *)poVar3,"AT LEVEL ");
      std::ostream::operator<<(poVar3,0);
      std::operator<<((ostream *)poVar3," ");
      std::ostream::operator<<(poVar3,iVar8);
      std::operator<<((ostream *)poVar3,"   DN: Norm before bottom ");
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
      std::operator<<((ostream *)poVar3,"\n");
      Print::~Print(&local_1b8);
    }
    bottomSolve(this);
    if (this->verbose < 4) goto LAB_004e4851;
    computeResOfCorrection(this,0,iVar8);
    (*this->linop->_vptr_MLLinOp[0x32])
              (this->linop,
               uVar9 * 8 +
               *(long *)&(this->rescor).
                         super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
    poVar4 = OutStream();
    Print::Print(&local_1b8,poVar4);
    poVar3 = &local_1b8.ss;
    std::operator<<((ostream *)poVar3,"AT LEVEL ");
    std::ostream::operator<<(poVar3,0);
    std::operator<<((ostream *)poVar3," ");
    std::ostream::operator<<(poVar3,iVar8);
    std::operator<<((ostream *)poVar3,"   UP: Norm after  bottom ");
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_04);
    std::operator<<((ostream *)poVar3,"\n");
  }
  else {
    pMVar6 = this->linop;
    if (3 < this->verbose) {
      (*pMVar6->_vptr_MLLinOp[0x32])
                (pMVar6,uVar9 * 8 +
                        *(long *)&(this->res).
                                  super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                  super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
      poVar4 = OutStream();
      Print::Print(&local_1b8,poVar4);
      poVar3 = &local_1b8.ss;
      std::operator<<((ostream *)poVar3,"AT LEVEL ");
      std::ostream::operator<<(poVar3,amrlev);
      std::operator<<((ostream *)poVar3," ");
      std::ostream::operator<<(poVar3,iVar8);
      std::operator<<((ostream *)poVar3,"       Norm before smooth ");
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
      std::operator<<((ostream *)poVar3,"\n");
      Print::~Print(&local_1b8);
      pMVar6 = this->linop;
    }
    lVar2 = uVar9 * 8;
    (*pMVar6->_vptr_MLLinOp[0x2e])
              (pMVar6,*(long *)&(this->cor).
                                super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2)
    ;
    for (iVar7 = 0; iVar7 < this->nu1; iVar7 = iVar7 + 1) {
      (*this->linop->_vptr_MLLinOp[0x39])
                (this->linop,amrlev,uVar9 & 0xffffffff,
                 *(long *)&(this->cor).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2,
                 *(long *)&(this->res).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2);
    }
    if (this->verbose < 4) goto LAB_004e4851;
    computeResOfCorrection(this,amrlev,iVar8);
    (*this->linop->_vptr_MLLinOp[0x32])
              (this->linop,
               lVar2 + *(long *)&(this->rescor).
                                 super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                 super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
    poVar4 = OutStream();
    Print::Print(&local_1b8,poVar4);
    poVar3 = &local_1b8.ss;
    std::operator<<((ostream *)poVar3,"AT LEVEL ");
    std::ostream::operator<<(poVar3,amrlev);
    std::operator<<((ostream *)poVar3," ");
    std::ostream::operator<<(poVar3,iVar8);
    std::operator<<((ostream *)poVar3,"       Norm after  smooth ");
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
    std::operator<<((ostream *)poVar3,"\n");
  }
  do {
    Print::~Print(&local_1b8);
LAB_004e4851:
    do {
      if ((long)uVar9 <= (long)mglev_top) {
        return;
      }
      uVar9 = uVar9 - 1;
      iVar8 = (int)uVar9;
      addInterpCorrection(this,amrlev,iVar8);
      if (3 < this->verbose) {
        computeResOfCorrection(this,amrlev,iVar8);
        (*this->linop->_vptr_MLLinOp[0x32])
                  (this->linop,
                   uVar9 * 8 +
                   *(long *)&(this->rescor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
        poVar4 = OutStream();
        Print::Print(&local_1b8,poVar4);
        poVar3 = &local_1b8.ss;
        std::operator<<((ostream *)poVar3,"AT LEVEL ");
        std::ostream::operator<<(poVar3,amrlev);
        std::operator<<((ostream *)poVar3," ");
        std::ostream::operator<<(poVar3,iVar8);
        std::operator<<((ostream *)poVar3,"   UP: Norm before smooth ");
        std::ostream::_M_insert<double>(extraout_XMM0_Qa_05);
        std::operator<<((ostream *)poVar3,"\n");
        Print::~Print(&local_1b8);
      }
      lVar2 = uVar9 * 8;
      for (iVar7 = 0; iVar7 < this->nu2; iVar7 = iVar7 + 1) {
        (*this->linop->_vptr_MLLinOp[0x39])
                  (this->linop,amrlev,uVar9 & 0xffffffff,
                   *(long *)&(this->cor).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2,
                   *(long *)&(this->res).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[amrlev].
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar2,0);
      }
      if (this->cf_strategy == ghostnodes) {
        computeResOfCorrection(this,amrlev,iVar8);
      }
    } while (this->verbose < 4);
    computeResOfCorrection(this,amrlev,iVar8);
    (*this->linop->_vptr_MLLinOp[0x32])
              (this->linop,
               lVar2 + *(long *)&(this->rescor).
                                 super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                 super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
    poVar4 = OutStream();
    Print::Print(&local_1b8,poVar4);
    poVar3 = &local_1b8.ss;
    std::operator<<((ostream *)poVar3,"AT LEVEL ");
    std::ostream::operator<<(poVar3,amrlev);
    std::operator<<((ostream *)poVar3," ");
    std::ostream::operator<<(poVar3,iVar8);
    std::operator<<((ostream *)poVar3,"   UP: Norm after  smooth ");
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_06);
    std::operator<<((ostream *)poVar3,"\n");
  } while( true );
}

Assistant:

void
MLMG::mgVcycle (int amrlev, int mglev_top)
{
    BL_PROFILE("MLMG::mgVcycle()");

    const int mglev_bottom = linop.NMGLevels(amrlev) - 1;

    for (int mglev = mglev_top; mglev < mglev_bottom; ++mglev)
    {
        BL_PROFILE_VAR("MLMG::mgVcycle_down::"+std::to_string(mglev), blp_mgv_down_lev);

        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   DN: Norm before smooth " << norm << "\n";
        }

        linop.AnySetToZero(cor[amrlev][mglev]);
        bool skip_fillboundary = true;
        for (int i = 0; i < nu1; ++i) {
            linop.AnySmooth(amrlev, mglev, cor[amrlev][mglev], res[amrlev][mglev],
                            skip_fillboundary);
            skip_fillboundary = false;
        }

        // rescor = res - L(cor)
        computeResOfCorrection(amrlev, mglev);

        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   DN: Norm after  smooth " << norm << "\n";
        }

        // res_crse = R(rescor_fine); this provides res/b to the level below
        linop.AnyRestriction(amrlev, mglev+1, res[amrlev][mglev+1], rescor[amrlev][mglev]);
    }

    BL_PROFILE_VAR("MLMG::mgVcycle_bottom", blp_bottom);
    if (amrlev == 0)
    {
        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "   DN: Norm before bottom " << norm << "\n";
        }
        bottomSolve();
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev_bottom);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev_bottom]);

            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "   UP: Norm after  bottom " << norm << "\n";
        }
    }
    else
    {
        if (verbose >= 4)
        {
            Real norm = linop.AnyNormInf(res[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev_bottom
                           << "       Norm before smooth " << norm << "\n";
        }
        linop.AnySetToZero(cor[amrlev][mglev_bottom]);
        bool skip_fillboundary = true;
        for (int i = 0; i < nu1; ++i) {
            linop.AnySmooth(amrlev, mglev_bottom, cor[amrlev][mglev_bottom],
                            res[amrlev][mglev_bottom], skip_fillboundary);
            skip_fillboundary = false;
        }
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev_bottom);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev_bottom]);
            amrex::Print() << "AT LEVEL "  << amrlev  << " " << mglev_bottom
                           << "       Norm after  smooth " << norm << "\n";
        }
    }
    BL_PROFILE_VAR_STOP(blp_bottom);

    for (int mglev = mglev_bottom-1; mglev >= mglev_top; --mglev)
    {
        BL_PROFILE_VAR("MLMG::mgVcycle_up::"+std::to_string(mglev), blp_mgv_up_lev);
        // cor_fine += I(cor_crse)
        addInterpCorrection(amrlev, mglev);
        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   UP: Norm before smooth " << norm << "\n";
        }
        for (int i = 0; i < nu2; ++i) {
            linop.AnySmooth(amrlev, mglev, cor[amrlev][mglev], res[amrlev][mglev]);
        }

        if (cf_strategy == CFStrategy::ghostnodes) computeResOfCorrection(amrlev, mglev);

        if (verbose >= 4)
        {
            computeResOfCorrection(amrlev, mglev);
            Real norm = linop.AnyNormInf(rescor[amrlev][mglev]);
            amrex::Print() << "AT LEVEL "  << amrlev << " " << mglev
                           << "   UP: Norm after  smooth " << norm << "\n";
        }
    }
}